

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_wrapper.h
# Opt level: O3

double L18_4::use_f<double,std::function<double(double)>>(double v,function<double_(double)> *f)

{
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  char cVar4;
  ostream *poVar5;
  undefined8 *puVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double local_20;
  
  use_f<double,_std::function<double_(double)>_>::count =
       use_f<double,_std::function<double_(double)>_>::count + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," use_f count = ",0xf);
  poVar5 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,use_f<double,_std::function<double_(double)>_>::count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", &count = ",0xb);
  poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
  cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  uVar7 = (ulong)(uint)(int)cVar4;
  puVar6 = (undefined8 *)std::ostream::put((char)poVar5);
  std::ostream::flush();
  local_20 = v;
  if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
    dVar1 = (*f->_M_invoker)((_Any_data *)f,&local_20);
    return dVar1;
  }
  std::__throw_bad_function_call();
  uVar8 = 0;
  uVar9 = 0;
  puVar6[2] = 0;
  puVar6[3] = 0;
  *puVar6 = 0;
  puVar6[1] = 0;
  if (*(code **)(uVar7 + 0x10) != (code *)0x0) {
    (**(code **)(uVar7 + 0x10))();
    uVar8 = *(undefined4 *)(uVar7 + 0x10);
    uVar9 = *(undefined4 *)(uVar7 + 0x14);
    uVar2 = *(undefined4 *)(uVar7 + 0x18);
    uVar3 = *(undefined4 *)(uVar7 + 0x1c);
    *(undefined4 *)(puVar6 + 2) = uVar8;
    *(undefined4 *)((long)puVar6 + 0x14) = uVar9;
    *(undefined4 *)(puVar6 + 3) = uVar2;
    *(undefined4 *)((long)puVar6 + 0x1c) = uVar3;
  }
  return (double)CONCAT44(uVar9,uVar8);
}

Assistant:

T use_f(T v, F f) {
        static int count = 0;
        count ++;
        std::cout << " use_f count = " << count << ", &count = " << &count << std::endl;
        return f(v);
    }